

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintStamp.cpp
# Opt level: O0

void __thiscall OpenMD::ConstraintStamp::~ConstraintStamp(ConstraintStamp *this)

{
  ConstraintStamp *in_RDI;
  
  ~ConstraintStamp(in_RDI);
  operator_delete(in_RDI,0xd8);
  return;
}

Assistant:

ConstraintStamp::~ConstraintStamp() {}